

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

void iutest::TestEnv::ParseCommandLine<char>(int *pargc,char **argv)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  int iVar4;
  int i;
  uint uVar5;
  undefined1 auVar6 [16];
  
  if (argv == (char **)0x0) {
    return;
  }
  iVar4 = *pargc;
  uVar5 = 0;
  do {
    while( true ) {
      if (iVar4 <= (int)uVar5) {
        *pargc = iVar4;
        return;
      }
      bVar2 = ParseCommandLineElemA(argv[uVar5]);
      if (!bVar2) break;
      iVar4 = iVar4 + -1;
      for (uVar3 = (ulong)uVar5; (long)uVar3 < (long)iVar4; uVar3 = uVar3 + 1) {
        auVar1 = *(undefined1 (*) [16])(argv + uVar3);
        auVar6._0_8_ = auVar1._8_8_;
        auVar6._8_4_ = auVar1._0_4_;
        auVar6._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])(argv + uVar3) = auVar6;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void ParseCommandLine(int* pargc, CharType** argv)
    {
        if( argv == NULL )
        {
            return;
        }
        int argc = *pargc;

        for( int i=0; i < argc; )
        {
            if( ParseCommandLineElem(argv[i]) )
            {
                --argc;
                // 見つかった場合、オプションを末尾に移動
                for( int k=i; k < argc; ++k )
                {
                    CharType* tmp = argv[k];
                    argv[k] = argv[k+1];
                    argv[k+1] = tmp;
                }
            }
            else
            {
                ++i;
            }
        }
        *pargc = argc;
    }